

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_ameth.c
# Opt level: O0

int dh_pub_encode(X509_PUBKEY *pk,EVP_PKEY *pkey)

{
  int iVar1;
  ASN1_STRING *a;
  ASN1_INTEGER *a_00;
  ASN1_OBJECT *aobj;
  long in_RSI;
  X509_PUBKEY *in_RDI;
  ASN1_INTEGER *pub_key;
  ASN1_STRING *str;
  int penclen;
  uchar *penc;
  int ptype;
  DH *dh;
  uchar **in_stack_ffffffffffffffa8;
  DH *in_stack_ffffffffffffffb0;
  EVP_PKEY *pkey_00;
  int iVar2;
  uchar *local_30;
  int local_24;
  long local_20;
  long local_18;
  X509_PUBKEY *local_10;
  
  local_30 = (uchar *)0x0;
  pkey_00 = (EVP_PKEY *)0x0;
  local_20 = *(long *)(in_RSI + 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  a = ASN1_STRING_new();
  if (a == (ASN1_STRING *)0x0) {
    ERR_new();
    ERR_set_debug((char *)a,(int)((ulong)pkey_00 >> 0x20),(char *)in_stack_ffffffffffffffb0);
    ERR_set_error(5,0xc0100,(char *)0x0);
  }
  else {
    iVar1 = i2d_dhp(pkey_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar2 = (int)((ulong)pkey_00 >> 0x20);
    a->length = iVar1;
    if (a->length < 1) {
      ERR_new();
      ERR_set_debug((char *)a,iVar2,(char *)in_stack_ffffffffffffffb0);
      ERR_set_error(5,0xc0100,(char *)0x0);
    }
    else {
      local_24 = 0x10;
      a_00 = BN_to_ASN1_INTEGER(*(BIGNUM **)(local_20 + 0x68),(ASN1_INTEGER *)0x0);
      if (a_00 != (ASN1_INTEGER *)0x0) {
        iVar1 = i2d_ASN1_INTEGER(a_00,&local_30);
        ASN1_INTEGER_free(a_00);
        iVar2 = (int)((ulong)a_00 >> 0x20);
        if (iVar1 < 1) {
          ERR_new();
          ERR_set_debug((char *)a,iVar2,(char *)in_stack_ffffffffffffffb0);
          ERR_set_error(5,0xc0100,(char *)0x0);
        }
        else {
          aobj = OBJ_nid2obj(**(int **)(local_18 + 8));
          iVar1 = X509_PUBKEY_set0_param(local_10,aobj,local_24,a,local_30,iVar1);
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
    }
  }
  CRYPTO_free(local_30);
  ASN1_STRING_free(a);
  return 0;
}

Assistant:

static int dh_pub_encode(X509_PUBKEY *pk, const EVP_PKEY *pkey)
{
    DH *dh;
    int ptype;
    unsigned char *penc = NULL;
    int penclen;
    ASN1_STRING *str;
    ASN1_INTEGER *pub_key = NULL;

    dh = pkey->pkey.dh;

    str = ASN1_STRING_new();
    if (str == NULL) {
        ERR_raise(ERR_LIB_DH, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    str->length = i2d_dhp(pkey, dh, &str->data);
    if (str->length <= 0) {
        ERR_raise(ERR_LIB_DH, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    ptype = V_ASN1_SEQUENCE;

    pub_key = BN_to_ASN1_INTEGER(dh->pub_key, NULL);
    if (pub_key == NULL)
        goto err;

    penclen = i2d_ASN1_INTEGER(pub_key, &penc);

    ASN1_INTEGER_free(pub_key);

    if (penclen <= 0) {
        ERR_raise(ERR_LIB_DH, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (X509_PUBKEY_set0_param(pk, OBJ_nid2obj(pkey->ameth->pkey_id),
                               ptype, str, penc, penclen))
        return 1;

 err:
    OPENSSL_free(penc);
    ASN1_STRING_free(str);

    return 0;
}